

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gkc.c
# Opt level: O0

uint64_t gkc_query(gkc_summary *s,double q)

{
  size_t sVar1;
  list *plVar2;
  list *plVar3;
  list *plVar4;
  int iVar5;
  int iVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  gkc_tuple *tnext;
  gkc_tuple *tcur;
  double ne;
  double gi;
  int rank;
  list *next;
  list *cur;
  double q_local;
  gkc_summary *s_local;
  
  sVar1 = s->nr_elems;
  auVar10._8_4_ = (int)(sVar1 >> 0x20);
  auVar10._0_8_ = sVar1;
  auVar10._12_4_ = 0x45300000;
  iVar5 = (int)(q * ((auVar10._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) + 0.5);
  sVar1 = s->nr_elems;
  auVar8._8_4_ = (int)(sVar1 >> 0x20);
  auVar8._0_8_ = sVar1;
  auVar8._12_4_ = 0x45300000;
  dVar7 = ((auVar8._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) * s->epsilon;
  ne = 0.0;
  iVar6 = list_empty(&s->head);
  if (iVar6 == 0) {
    next = (s->head).next;
    do {
      plVar4 = next + -2;
      plVar3 = next->next;
      if (plVar3 == &s->head) {
        return (uint64_t)plVar4->next;
      }
      ne = ne + (double)next[-1].prev;
      plVar2 = plVar3[-1].next;
      auVar9._8_4_ = (int)((ulong)plVar2 >> 0x20);
      auVar9._0_8_ = plVar2;
      auVar9._12_4_ = 0x45300000;
      next = plVar3;
    } while (ne + (double)plVar3[-1].prev +
             (auVar9._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)plVar2) - 4503599627370496.0) <=
             (double)iVar5 + dVar7);
    if (ne + (double)plVar3[-1].prev <= (double)iVar5 + dVar7) {
      s_local = (gkc_summary *)plVar3[-2].next;
    }
    else {
      s_local = (gkc_summary *)plVar4->next;
    }
  }
  else {
    s_local = (gkc_summary *)0x0;
  }
  return (uint64_t)s_local;
}

Assistant:

uint64_t gkc_query(struct gkc_summary *s, double q)
{
    struct list *cur, *next;
    int rank;
    double gi;
    double ne;

    rank = 0.5 + q * s->nr_elems;
    ne = s->nr_elems * s->epsilon;
    gi = 0;
    if (list_empty(&s->head)) {
        return 0;
    }

    cur = s->head.next;

    while (1) {
        struct gkc_tuple *tcur, *tnext;

        tcur = list_to_tuple(cur);
        next = cur->next;
        if (next == &s->head) {
            return tcur->value;
        }
        tnext = list_to_tuple(next);

        gi += tcur->g;
        if ((rank + ne) < (gi + tnext->g + tnext->delta)) {
            if ((rank + ne) < (gi + tnext->g)) {
                return tcur->value;
            }
            return tnext->value;
        }
        cur = next;
    }
}